

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_can_test.cpp
# Opt level: O0

void __thiscall SocketCAN::Socket::Socket(Socket *this,char *ifc)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 local_38 [8];
  sockaddr_can addr;
  uint ifindx;
  char *ifc_local;
  Socket *this_local;
  
  iVar1 = socket(0x1d,3,1);
  this->_fd = iVar1;
  if (iVar1 < 0) {
    perror("Error while opening socket");
  }
  else {
    addr.can_addr._12_4_ = if_nametoindex(ifc);
    if (addr.can_addr._12_4_ == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to get the SocketCAN interface index: "
                              );
      poVar2 = std::operator<<(poVar2,ifc);
      poVar2 = std::operator<<(poVar2,": error");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      close(this->_fd);
    }
    else {
      addr.can_family = 0;
      addr._2_2_ = 0;
      addr.can_ifindex = 0;
      addr.can_addr.j1939.name = 0;
      local_38._4_4_ = addr.can_addr._12_4_;
      local_38._0_4_ = 0x1d;
      iVar1 = bind(this->_fd,(sockaddr *)local_38,0x18);
      if (iVar1 < 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to bind to the can socket: ");
        poVar2 = std::operator<<(poVar2,ifc);
        poVar2 = std::operator<<(poVar2,": error");
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        poVar2 = std::operator<<(poVar2,pcVar4);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        close(this->_fd);
      }
    }
  }
  return;
}

Assistant:

Socket(const char* ifc) {

    if((_fd = socket(PF_CAN, SOCK_RAW, CAN_RAW)) < 0) {
      perror("Error while opening socket");
      return;
    }

    auto ifindx = if_nametoindex(ifc);
    if (ifindx <= 0) {
      std::cerr << "Failed to get the SocketCAN interface index: "
                << ifc << ": error" << strerror(errno) << std::endl;

      close(_fd);
      return;
    }

    struct sockaddr_can addr{0};

    addr.can_family  = AF_CAN;
    addr.can_ifindex = static_cast<int>(ifindx);

    if(bind(_fd, reinterpret_cast<struct sockaddr *>(&addr), sizeof(addr)) < 0) {
      std::cerr << "Failed to bind to the can socket: "
                << ifc << ": error" << strerror(errno) << std::endl;

      close(_fd);
      return;
    }

  }